

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalDeallocate
          (RepeatedField<unsigned_int> *this,Rep *rep,int size)

{
  size_t bytes;
  uint *limit;
  uint *e;
  int size_local;
  Rep *rep_local;
  RepeatedField<unsigned_int> *this_local;
  
  if (rep != (Rep *)0x0) {
    for (limit = rep->elements; limit < rep->elements + size; limit = limit + 1) {
    }
    if (rep->arena == (Arena *)0x0) {
      operator_delete(rep,(long)size * 4 + 8);
    }
  }
  return;
}

Assistant:

void InternalDeallocate(Rep* rep, int size) {
    if (rep != NULL) {
      Element* e = &rep->elements[0];
      Element* limit = &rep->elements[size];
      for (; e < limit; e++) {
        e->Element::~Element();
      }
      if (rep->arena == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
        const size_t bytes = size * sizeof(*e) + kRepHeaderSize;
        ::operator delete(static_cast<void*>(rep), bytes);
#else
        ::operator delete(static_cast<void*>(rep));
#endif
      }
    }
  }